

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformedBilinear_pixelBounds<(TextureBlendType)5>
               (int max,int param_2,int param_3,int *v1,int *v2)

{
  int *v2_local;
  int *v1_local;
  int param_2_local;
  int param_1_local;
  int max_local;
  
  *v1 = *v1 % max;
  if (*v1 < 0) {
    *v1 = max + *v1;
  }
  *v2 = *v1 + 1;
  if (*v2 == max) {
    *v2 = 0;
  }
  return;
}

Assistant:

inline void fetchTransformedBilinear_pixelBounds<BlendTransformedBilinearTiled>(int max, int, int, int &v1, int &v2)
{
    v1 %= max;
    if (v1 < 0)
        v1 += max;
    v2 = v1 + 1;
    if (v2 == max)
        v2 = 0;
    Q_ASSERT(v1 >= 0 && v1 < max);
    Q_ASSERT(v2 >= 0 && v2 < max);
}